

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseExpr
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this)

{
  deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
  *this_00;
  long lVar1;
  undefined1 v1 [16];
  undefined1 v2 [16];
  bool bVar2;
  __int128 *p_Var3;
  pointer pcVar4;
  long lVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  ExpressionParser<__int128> *pEVar7;
  undefined8 uVar8;
  Operator OVar9;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  __int128 *in_stack_ffffffffffffff98;
  _Alloc_hider local_58;
  int local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
             *)((long)__return_storage_ptr__ + 0x28);
  pEVar7 = (ExpressionParser<__int128> *)&stack0xffffffffffffffa8;
  local_58._M_p = (pointer)0x0;
  local_50 = 0x4c;
  local_48 = (__int128 *)0x0;
  uStack_40 = 0;
  std::
  deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
  ::emplace_back<calculator::ExpressionParser<__int128>::OperatorValue>
            (this_00,(OperatorValue *)pEVar7);
  p_Var3 = parseValue(__return_storage_ptr__,pEVar7);
  uVar8 = extraout_RDX;
  do {
    if (*(long *)((long)__return_storage_ptr__ + 0x58) ==
        *(long *)((long)__return_storage_ptr__ + 0x38)) {
      return (__int128 *)0x0;
    }
    OVar9 = parseOp((ExpressionParser<__int128> *)__return_storage_ptr__);
    pcVar4 = OVar9._0_8_;
    while( true ) {
      lVar6 = *(long *)((long)__return_storage_ptr__ + 0x58);
      lVar1 = (long)__return_storage_ptr__[6];
      lVar5 = lVar6;
      if (lVar6 == lVar1) {
        lVar5 = *(long *)((long)__return_storage_ptr__[7] + -8) + 0x200;
      }
      if (*(int *)(lVar5 + -0x1c) <= OVar9.precedence) {
        lVar5 = lVar6;
        if (lVar6 == lVar1) {
          lVar5 = *(long *)((long)__return_storage_ptr__[7] + -8) + 0x200;
        }
        if ((*(int *)(lVar5 + -0x1c) != OVar9.precedence) || (OVar9.associativity != 0x4c)) {
          pEVar7 = (ExpressionParser<__int128> *)&stack0xffffffffffffffa8;
          local_58._M_p = pcVar4;
          local_50 = OVar9.associativity;
          local_48 = p_Var3;
          uStack_40 = uVar8;
          std::
          deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
          ::emplace_back<calculator::ExpressionParser<__int128>::OperatorValue>
                    (this_00,(OperatorValue *)pEVar7);
          p_Var3 = parseValue(__return_storage_ptr__,pEVar7);
          bVar2 = true;
          uVar8 = extraout_RDX_01;
          goto LAB_00118d96;
        }
      }
      lVar5 = lVar6;
      if (lVar6 == lVar1) {
        lVar5 = *(long *)((long)__return_storage_ptr__[7] + -8) + 0x200;
      }
      if (*(int *)(lVar5 + -0x20) == 0) break;
      if (lVar6 == lVar1) {
        lVar6 = *(long *)((long)__return_storage_ptr__[7] + -8) + 0x200;
      }
      v1._8_8_ = in_stack_ffffffffffffff90;
      v1._0_8_ = in_stack_ffffffffffffff88;
      v2._8_8_ = pcVar4;
      v2._0_8_ = in_stack_ffffffffffffff98;
      p_Var3 = calculate(__return_storage_ptr__,*(ExpressionParser<__int128> **)(lVar6 + -0x10),
                         (__int128)v1,(__int128)v2,*(Operator **)(lVar6 + -8));
      std::
      deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
      ::pop_back(this_00);
      uVar8 = extraout_RDX_00;
    }
    std::
    deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
    ::pop_back(this_00);
    bVar2 = false;
    in_stack_ffffffffffffff90 = uVar8;
    in_stack_ffffffffffffff98 = p_Var3;
LAB_00118d96:
    if (!bVar2) {
      return in_stack_ffffffffffffff98;
    }
  } while( true );
}

Assistant:

T parseExpr()
  {
    stack_.push(OperatorValue(Operator(OPERATOR_NULL, 0, 'L'), 0));
    // first parse value on the left
    T value = parseValue();

    while (!stack_.empty())
    {
      // parse an operator (+, -, *, ...)
      Operator op(parseOp());
      while (op.precedence  < stack_.top().getPrecedence() || (
             op.precedence == stack_.top().getPrecedence() &&
             op.associativity == 'L'))
      {
        // end reached
        if (stack_.top().isNull())
        {
          stack_.pop();
          return value;
        }
        // do the calculation ("reduce"), producing a new value
        value = calculate(stack_.top().value, value, stack_.top().op);
        stack_.pop();
      }

      // store on stack_ and continue parsing ("shift")
      stack_.push(OperatorValue(op, value));
      // parse value on the right
      value = parseValue();
    }
    return 0;
  }